

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::float_writer<char>::float_writer
          (float_writer<char> *this,char *digits,int num_digits,int exp,float_specs specs,
          char decimal_point)

{
  size_t sVar1;
  int local_54;
  counting_iterator local_48;
  counting_iterator local_40;
  int local_34;
  int local_30;
  int precision;
  int full_exp;
  int iStack_24;
  char decimal_point_local;
  int exp_local;
  int num_digits_local;
  char *digits_local;
  float_writer<char> *this_local;
  float_specs specs_local;
  
  this->digits_ = digits;
  this->num_digits_ = num_digits;
  this->exp_ = exp;
  this->specs_ = specs;
  this->decimal_point_ = decimal_point;
  local_30 = num_digits + exp + -1;
  this_local._0_4_ = specs.precision;
  if ((int)this_local < 1) {
    local_54 = 0x10;
  }
  else {
    local_54 = (int)this_local;
  }
  local_34 = local_54;
  if (((char)*(undefined4 *)&(this->specs_).field_0x4 == '\0') &&
     ((local_30 < -4 || (local_54 <= local_30)))) {
    *(uint *)&(this->specs_).field_0x4 = *(uint *)&(this->specs_).field_0x4 & 0xffffff00 | 1;
  }
  precision._3_1_ = decimal_point;
  full_exp = exp;
  iStack_24 = num_digits;
  _exp_local = digits;
  digits_local = (char *)this;
  this_local = (float_writer<char> *)specs;
  counting_iterator::counting_iterator(&local_48);
  local_40 = prettify<fmt::v6::detail::counting_iterator>(this,local_48);
  sVar1 = counting_iterator::count(&local_40);
  this->size_ = sVar1;
  this->size_ = (long)(int)(uint)((this_local._4_4_ >> 8 & 0xff) != 0) + this->size_;
  return;
}

Assistant:

float_writer(const char* digits, int num_digits, int exp, float_specs specs,
               Char decimal_point)
      : digits_(digits),
        num_digits_(num_digits),
        exp_(exp),
        specs_(specs),
        decimal_point_(decimal_point) {
    int full_exp = num_digits + exp - 1;
    int precision = specs.precision > 0 ? specs.precision : 16;
    if (specs_.format == float_format::general &&
        !(full_exp >= -4 && full_exp < precision)) {
      specs_.format = float_format::exp;
    }
    size_ = prettify(counting_iterator()).count();
    size_ += specs.sign ? 1 : 0;
  }